

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteBook(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    Io_Write(pAbc->pNtkCur,argv[globalUtilOptind],IO_FILE_BOOK);
    iVar1 = 0;
  }
  else {
    fwrite("usage: write_book [-h] <file> [-options]\n",0x29,1,(FILE *)pAbc->Err);
    fwrite("\t-h     : prints the help massage\n",0x22,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of the file to write (extension .aux, .nodes, .nets)\n",0x48,1,
           (FILE *)pAbc->Err);
    fwrite("\t\n",2,1,(FILE *)pAbc->Err);
    fwrite("\tThis command is developed by Myungchul Kim (University of Michigan).\n",0x46,1,
           (FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int IoCommandWriteBook( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
        int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
        // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_BOOK );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_book [-h] <file> [-options]\n" );
    fprintf( pAbc->Err, "\t-h     : prints the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .aux, .nodes, .nets)\n" );
    fprintf( pAbc->Err, "\t\n" );
    fprintf( pAbc->Err, "\tThis command is developed by Myungchul Kim (University of Michigan).\n" );
    return 1;
}